

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O3

void Am_Inplace_Move_Prev(Am_Object *text)

{
  byte bVar1;
  char cVar2;
  Am_Value *pAVar3;
  long *plVar4;
  ushort uVar5;
  Am_String value;
  Am_Object local_30;
  Am_String local_28;
  
  uVar5 = (ushort)text;
  pAVar3 = (Am_Value *)Am_Object::Get(uVar5,(ulong)Am_INPLACE_TEXT_NAV);
  plVar4 = (long *)Am_Value::operator_cast_to_void_(pAVar3);
  if (plVar4 != (long *)0x0) {
    pAVar3 = (Am_Value *)Am_Object::Get(uVar5,0xab);
    Am_String::Am_String(&local_28,pAVar3);
    bVar1 = Am_String::operator==(&local_28,"");
    cVar2 = (**(code **)(*plVar4 + (ulong)bVar1 * 0x10))(plVar4,4);
    Am_Object::Note_Changed(uVar5);
    if (cVar2 != '\0') {
      Am_Object::Am_Object(&local_30,text);
      Am_Move_Cursor_To_End((Am_Object_Data *)&local_30);
      Am_Object::~Am_Object(&local_30);
    }
    Am_String::~Am_String(&local_28);
  }
  return;
}

Assistant:

static void
Am_Inplace_Move_Prev(Am_Object text)
{
  Am_Text_Navigate *text_nav =
      Am_Text_Navigate::Narrow((Am_Ptr)text.Get(Am_INPLACE_TEXT_NAV));
  if (text_nav) {
    Am_String value = text.Get(Am_TEXT);
    bool success;
    if (value == "")
      success = text_nav->Delete(Am_INPLACE_PREV);
    else
      success = text_nav->Move(Am_INPLACE_PREV);
    text.Note_Changed(Am_INPLACE_TEXT_INFO);
    if (success)
      Am_Move_Cursor_To_End(text);
  }
}